

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Texture2DArrayFilteringCase::init
          (Texture2DArrayFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  *this_00;
  uint height;
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  Texture2DArray *pTVar3;
  RenderTarget *pRVar4;
  int layerNdx_1;
  int z;
  int layerNdx;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  IVec4 swz;
  Vector<float,_4> local_1a8;
  ulong local_190;
  RGBA local_188;
  RGBA local_184;
  Vec4 gMin;
  Vec4 gMax;
  PixelBufferAccess levelBuf;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_120;
  Vec4 cBias;
  Vec4 cScale;
  PixelBufferAccess local_f8;
  TextureFormat texFmt;
  Vector<int,_4> local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  Vector<float,_4> local_80;
  TextureFormatInfo fmtInfo;
  
  texFmt = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
  tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
  uVar5 = this->m_width;
  height = this->m_height;
  uVar2 = height;
  if ((int)height < (int)uVar5) {
    uVar2 = uVar5;
  }
  uVar7 = 0x20;
  if (uVar2 != 0) {
    uVar7 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  pTVar3 = (Texture2DArray *)operator_new(0x70);
  glu::Texture2DArray::Texture2DArray
            (pTVar3,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar5,
             height,this->m_numLayers);
  this->m_gradientTex = pTVar3;
  pTVar3 = (Texture2DArray *)operator_new(0x70);
  glu::Texture2DArray::Texture2DArray
            (pTVar3,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_width,this->m_height,this->m_numLayers);
  uVar7 = 0x20 - uVar7;
  this->m_gridTex = pTVar3;
  local_c8.m_data[0] = 0;
  local_c8.m_data[1] = 1;
  local_c8.m_data[2] = 2;
  local_c8.m_data[3] = 3;
  local_b8 = 0x100000002;
  uStack_b0 = 3;
  local_a8 = 3;
  uStack_a0 = 0x200000001;
  local_98 = 0x300000001;
  uStack_90 = 2;
  local_120 = (ulong)uVar7;
  uVar6 = 0;
  while (uVar6 != local_120) {
    tcu::Texture2DArray::allocLevel(&this->m_gradientTex->m_refTexture,(int)uVar6);
    local_190 = uVar6;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&levelBuf.super_ConstPixelBufferAccess,
               &(this->m_gradientTex->m_refTexture).super_TextureLevelPyramid.m_access.
                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar6].super_ConstPixelBufferAccess);
    for (uVar5 = 0; (int)uVar5 < this->m_numLayers; uVar5 = uVar5 + 1) {
      tcu::Vector<int,_4>::Vector
                (&swz,(Vector<int,_4> *)((long)local_c8.m_data + (ulong)((uVar5 & 3) << 4)));
      local_1a8.m_data[0] = 0.0;
      local_1a8.m_data[1] = 0.0;
      local_1a8.m_data[2] = 0.0;
      local_1a8.m_data[3] = 1.0;
      gMax.m_data[0] = local_1a8.m_data[swz.m_data[0]];
      gMax.m_data[1] = local_1a8.m_data[swz.m_data[1]];
      gMax.m_data[2] = local_1a8.m_data[swz.m_data[2]];
      gMax.m_data[3] = local_1a8.m_data[swz.m_data[3]];
      tcu::operator*((tcu *)&local_f8,(Vector<float,_4> *)&gMax,&cScale);
      tcu::operator+((tcu *)&gMin,(Vector<float,_4> *)&local_f8,&cBias);
      local_138 = 0x3f8000003f800000;
      uStack_130 = 0x3f800000;
      local_1a8.m_data[1] = *(float *)((long)&local_138 + (long)swz.m_data[1] * 4);
      local_1a8.m_data[0] = *(float *)((long)&local_138 + (long)swz.m_data[0] * 4);
      local_1a8.m_data[3] = *(float *)((long)&local_138 + (long)swz.m_data[3] * 4);
      local_1a8.m_data[2] = *(float *)((long)&local_138 + (long)swz.m_data[2] * 4);
      tcu::operator*((tcu *)&local_f8,&local_1a8,&cScale);
      tcu::operator+((tcu *)&gMax,(Vector<float,_4> *)&local_f8,&cBias);
      tcu::getSubregion(&local_f8,&levelBuf,0,0,uVar5,
                        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
      tcu::fillWithComponentGradients(&local_f8,&gMin,&gMax);
    }
    uVar6 = local_190 + 1;
  }
  uVar6 = 0;
  while (uVar6 != local_120) {
    tcu::Texture2DArray::allocLevel(&this->m_gridTex->m_refTexture,(int)uVar6);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&levelBuf.super_ConstPixelBufferAccess,
               &(this->m_gridTex->m_refTexture).super_TextureLevelPyramid.m_access.
                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar6].super_ConstPixelBufferAccess);
    local_190 = uVar6;
    for (z = 0; iVar1 = this->m_numLayers, z < iVar1; z = z + 1) {
      tcu::getSubregion(&local_f8,&levelBuf,0,0,z,
                        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
      uVar5 = (int)(0xffffff / (long)(int)(iVar1 * uVar7 + -1)) * (int)uVar6;
      local_184.m_value = uVar5 | 0xff000000;
      tcu::RGBA::toVec(&local_184);
      tcu::operator*((tcu *)&gMin,&gMax,&cScale);
      tcu::operator+((tcu *)&swz,&gMin,&cBias);
      local_188.m_value = ~uVar5 | 0xff000000;
      tcu::RGBA::toVec(&local_188);
      tcu::operator*((tcu *)&local_138,&local_80,&cScale);
      tcu::operator+((tcu *)&local_1a8,(Vector<float,_4> *)&local_138,&cBias);
      tcu::fillWithGrid(&local_f8,4,(Vec4 *)&swz,(Vec4 *)&local_1a8);
      uVar6 = (ulong)((int)uVar6 + uVar7);
    }
    uVar6 = local_190 + 1;
  }
  glu::Texture2DArray::upload(this->m_gradientTex);
  glu::Texture2DArray::upload(this->m_gridTex);
  local_f8.super_ConstPixelBufferAccess.m_format.order = 0x3fc00000;
  local_f8.super_ConstPixelBufferAccess.m_format.type = 0x40333333;
  swz.m_data[0] = -0x40800000;
  swz.m_data[1] = -0x3fd33333;
  gMin.m_data[1] = (float)this->m_numLayers + 0.5;
  gMin.m_data[0] = -0.5;
  FilterCase::FilterCase
            ((FilterCase *)&levelBuf,this->m_gradientTex,(Vec2 *)&local_f8,(Vec2 *)&swz,
             (Vec2 *)&gMin);
  this_00 = &this->m_cases;
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
            (this_00,(FilterCase *)&levelBuf);
  local_f8.super_ConstPixelBufferAccess.m_format.order = 0x3e4ccccd;
  local_f8.super_ConstPixelBufferAccess.m_format.type = 0x3e333333;
  swz.m_data[0] = -0x40000000;
  swz.m_data[1] = -0x3f933333;
  gMin.m_data[1] = (float)this->m_numLayers + 0.5;
  gMin.m_data[0] = -0.5;
  FilterCase::FilterCase
            ((FilterCase *)&levelBuf,this->m_gridTex,(Vec2 *)&local_f8,(Vec2 *)&swz,(Vec2 *)&gMin);
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
            (this_00,(FilterCase *)&levelBuf);
  local_f8.super_ConstPixelBufferAccess.m_format.order = 0xbf4ccccd;
  local_f8.super_ConstPixelBufferAccess.m_format.type = 0xc0133333;
  swz.m_data[0] = 0x3e4ccccd;
  swz.m_data[1] = -0x42333333;
  gMin.m_data[1] = -0.5;
  gMin.m_data[0] = (float)this->m_numLayers + 0.5;
  FilterCase::FilterCase
            ((FilterCase *)&levelBuf,this->m_gridTex,(Vec2 *)&local_f8,(Vec2 *)&swz,(Vec2 *)&gMin);
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
            (this_00,(FilterCase *)&levelBuf);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar4->m_numSamples == 0) {
    local_f8.super_ConstPixelBufferAccess.m_format.order = 0xc0000000;
    local_f8.super_ConstPixelBufferAccess.m_format.type = 0xbfc00000;
    swz.m_data[0] = -0x42333333;
    swz.m_data[1] = 0x3f666666;
    gMin.m_data[0] = 1.50001;
    gMin.m_data[1] = 1.49999;
    FilterCase::FilterCase
              ((FilterCase *)&levelBuf,this->m_gradientTex,(Vec2 *)&local_f8,(Vec2 *)&swz,
               (Vec2 *)&gMin);
    std::
    vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>
              (this_00,(FilterCase *)&levelBuf);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DArrayFilteringCase::init (void)
{
	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(de::max(m_width, m_height)) + 1;

		// Create textures.
		m_gradientTex	= new glu::Texture2DArray(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_numLayers);
		m_gridTex		= new glu::Texture2DArray(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_numLayers);

		const tcu::IVec4 levelSwz[] =
		{
			tcu::IVec4(0,1,2,3),
			tcu::IVec4(2,1,3,0),
			tcu::IVec4(3,0,1,2),
			tcu::IVec4(1,3,2,0),
		};

		// Fill first gradient texture (gradient direction varies between layers).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gradientTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gradientTex->getRefTexture().getLevel(levelNdx);

			for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
			{
				const tcu::IVec4	swz		= levelSwz[layerNdx%DE_LENGTH_OF_ARRAY(levelSwz)];
				const tcu::Vec4		gMin	= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;
				const tcu::Vec4		gMax	= tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;

				tcu::fillWithComponentGradients(tcu::getSubregion(levelBuf, 0, 0, layerNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1), gMin, gMax);
			}
		}

		// Fill second with grid texture (each layer has unique colors).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gridTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gridTex->getRefTexture().getLevel(levelNdx);

			for (int layerNdx = 0; layerNdx < m_numLayers; layerNdx++)
			{
				const deUint32	step	= 0x00ffffff / (numLevels*m_numLayers - 1);
				const deUint32	rgb		= step * (levelNdx + layerNdx*numLevels);
				const deUint32	colorA	= 0xff000000 | rgb;
				const deUint32	colorB	= 0xff000000 | ~rgb;

				tcu::fillWithGrid(tcu::getSubregion(levelBuf, 0, 0, layerNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1),
								  4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec2( 1.5f,  2.8f  ),	tcu::Vec2(-1.0f, -2.7f), tcu::Vec2(-0.5f, float(m_numLayers)+0.5f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec2( 0.2f,  0.175f),	tcu::Vec2(-2.0f, -3.7f), tcu::Vec2(-0.5f, float(m_numLayers)+0.5f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec2(-0.8f, -2.3f  ),	tcu::Vec2( 0.2f, -0.1f), tcu::Vec2(float(m_numLayers)+0.5f, -0.5f)));

		// Level rounding - only in single-sample configs as multisample configs may produce smooth transition at the middle.
		if (m_context.getRenderTarget().getNumSamples() == 0)
			m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec2(-2.0f, -1.5f  ),	tcu::Vec2(-0.1f,  0.9f), tcu::Vec2(1.50001f, 1.49999f)));

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture2DArrayFilteringCase::deinit();
		throw;
	}
}